

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O2

shared_ptr<Image> runRippleStage(Image *previous,WaterEffectOptions *options)

{
  Image *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<Image> sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::make_shared<Image,unsigned_int_const&,unsigned_int_const&>
            ((uint *)previous,(uint *)&options->blur);
  applyRipple((Image *)options,(Image *)previous->pixels,
              *(float *)((long)&in_RDX[1]._M_string_length + 4));
  _Var1._M_pi = extraout_RDX;
  if (in_RDX[1].field_2._M_local_buf[0] == '\x01') {
    this = (Image *)previous->pixels;
    std::operator+(&bStack_58,"output/",in_RDX);
    std::operator+(&local_38,&bStack_58,"_rippled.png");
    Image::toPNG(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&bStack_58);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = previous;
  return (shared_ptr<Image>)sVar2.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Image> runRippleStage(const Image *previous, const WaterEffectOptions *options) {
  // Create a new image to store the result
  auto img_rippled = std::make_shared<Image>(previous->width, previous->height);

  // Apply the ripple effect
  applyRipple(previous, img_rippled.get(), options->ripple_frequency);

  // Save the resulting image
  if (options->save_intermediate)
    img_rippled->toPNG("output/" + options->img_name + "_rippled.png");

  return img_rippled;
}